

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O3

float Map_CutRefDeref(Map_Cut_t *pCut,int fPhase,int fReference,int fUpdateProf)

{
  int *piVar1;
  int iVar2;
  Mio_Gate_t *pGate;
  Map_Node_t *pMVar3;
  uint fPhase_00;
  int iVar4;
  Map_Cut_t *pCut_00;
  long lVar5;
  float fVar6;
  float local_34;
  
  local_34 = 0.0;
  if (pCut->nLeaves != '\x01') {
    local_34 = Map_CutGetRootArea(pCut,fPhase);
    if (fUpdateProf != 0) {
      pGate = (pCut->M[fPhase].pSuperBest)->pRoot;
      if (fReference == 0) {
        Mio_GateDecProfile2(pGate);
      }
      else {
        Mio_GateIncProfile2(pGate);
      }
    }
    if ('\0' < pCut->nLeaves) {
      lVar5 = 0;
      do {
        pMVar3 = pCut->ppLeaves[lVar5];
        fPhase_00 = Map_CutGetLeafPhase(pCut,fPhase,(int)lVar5);
        if (fReference == 0) {
          if ((pMVar3->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar3->pCutBest[1] == (Map_Cut_t *)0x0)
             ) {
            piVar1 = pMVar3->nRefAct + (int)fPhase_00;
            *piVar1 = *piVar1 + -1;
            if ((*piVar1 == 0) && (pMVar3->pCutBest[(int)fPhase_00] == (Map_Cut_t *)0x0)) {
              local_34 = local_34 + pMVar3->p->pSuperLib->AreaInv;
            }
            iVar4 = pMVar3->nRefAct[2];
            pMVar3->nRefAct[2] = iVar4 + -1;
            if (iVar4 < 2) {
              iVar4 = pMVar3->nRefAct[(int)fPhase_00];
              goto LAB_003fff53;
            }
          }
          else {
            pMVar3->nRefAct[2] = pMVar3->nRefAct[2] + -1;
            iVar2 = pMVar3->nRefAct[(int)fPhase_00];
            iVar4 = iVar2 + -1;
            pMVar3->nRefAct[(int)fPhase_00] = iVar4;
            if (iVar2 < 2) {
LAB_003fff53:
              if (iVar4 < 0) {
                __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                              ,0x133,"float Map_CutRefDeref(Map_Cut_t *, int, int, int)");
              }
              goto LAB_003fff57;
            }
          }
        }
        else {
          if ((pMVar3->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar3->pCutBest[1] == (Map_Cut_t *)0x0)
             ) {
            iVar4 = pMVar3->nRefAct[(int)fPhase_00];
            pMVar3->nRefAct[(int)fPhase_00] = iVar4 + 1;
            if ((iVar4 == 0) && (pMVar3->pCutBest[(int)fPhase_00] == (Map_Cut_t *)0x0)) {
              local_34 = local_34 + pMVar3->p->pSuperLib->AreaInv;
            }
            iVar4 = pMVar3->nRefAct[2];
            pMVar3->nRefAct[2] = iVar4 + 1;
          }
          else {
            pMVar3->nRefAct[2] = pMVar3->nRefAct[2] + 1;
            iVar4 = pMVar3->nRefAct[(int)fPhase_00];
            pMVar3->nRefAct[(int)fPhase_00] = iVar4 + 1;
          }
          if (0 < iVar4) goto LAB_003fff90;
LAB_003fff57:
          pCut_00 = pMVar3->pCutBest[(int)fPhase_00];
          if (pCut_00 == (Map_Cut_t *)0x0) {
            pCut_00 = pMVar3->pCutBest[fPhase_00 == 0];
            fPhase_00 = (uint)(fPhase_00 == 0);
          }
          fVar6 = Map_CutRefDeref(pCut_00,fPhase_00,fReference,fUpdateProf);
          local_34 = local_34 + fVar6;
        }
LAB_003fff90:
        lVar5 = lVar5 + 1;
      } while (lVar5 < pCut->nLeaves);
    }
  }
  return local_34;
}

Assistant:

float Map_CutRefDeref( Map_Cut_t * pCut, int fPhase, int fReference, int fUpdateProf )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aArea;
    int i, fPhaseChild;
//    int nRefs;

    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return 0;
    // start the area of this cut
    aArea = Map_CutGetRootArea( pCut, fPhase );
    if ( fUpdateProf )
    {
        if ( fReference )
            Mio_GateIncProfile2( pCut->M[fPhase].pSuperBest->pRoot );
        else
            Mio_GateDecProfile2( pCut->M[fPhase].pSuperBest->pRoot );
    }
    // go through the children
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child
/*
        // this code does not take inverters into account
        // the quality of area recovery seems to always be a little worse
        if ( fReference )
            nRefs = Map_NodeIncRefPhaseAct( pNodeChild, fPhaseChild );
        else
            nRefs = Map_NodeDecRefPhaseAct( pNodeChild, fPhaseChild );
        assert( nRefs >= 0 );
        // skip if the child was already reference before
        if ( nRefs > 0 )
            continue;
*/

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aArea += Map_CutRefDeref( pCutChild, fPhaseChild, fReference, fUpdateProf );
    }
    return aArea;
}